

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetTxInOnly_Test::TestBody(Psbt_SetTxInOnly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TxInReference txin_r;
  TxIn txin_l;
  TxIn txin_w;
  AssertionResult gtest_ar;
  Psbt psbt;
  type *in_stack_fffffffffffffbd8;
  Psbt *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  char *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  AssertHelper local_3c0;
  Message local_3b8;
  string local_3b0 [32];
  AssertionResult local_390;
  AssertHelper local_380;
  Message local_378 [4];
  string local_358 [32];
  AssertionResult local_338;
  AssertHelper local_328;
  Message local_320;
  undefined4 local_318;
  undefined4 local_314;
  AssertionResult local_310;
  TxInReference local_300 [151];
  allocator local_269;
  string local_268 [32];
  Txid local_248;
  TxIn local_228 [151];
  allocator local_191;
  string local_190 [32];
  Txid local_170;
  TxIn local_150 [144];
  AssertHelper local_c0;
  Message local_b8 [3];
  undefined4 local_a0;
  undefined4 local_9c;
  AssertionResult local_98;
  Psbt local_88;
  
  cfd::Psbt::Psbt(&local_88);
  local_9c = 0;
  local_a0 = cfd::core::Psbt::GetTxInCount();
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
             in_stack_fffffffffffffbf0,
             (int *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
             (uint *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x255a59);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x32c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x255ab6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x255b0e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_190,"c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26",&local_191
            );
  cfd::core::Txid::Txid(&local_170,local_190);
  cfd::core::TxIn::TxIn(local_150,&local_170,1,0xffffffff);
  cfd::core::Txid::~Txid((Txid *)0x255b80);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_268,"c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d",&local_269
            );
  cfd::core::Txid::Txid(&local_248,local_268);
  cfd::core::TxIn::TxIn(local_228,&local_248,0,0xffffffff);
  cfd::core::Txid::~Txid((Txid *)0x255c09);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  cfd::core::TxInReference::TxInReference(local_300,local_228);
  cfd::core::Psbt::AddTxIn((TxIn *)&local_88);
  cfd::core::Psbt::AddTxIn((TxInReference *)&local_88);
  local_314 = 2;
  local_318 = cfd::core::Psbt::GetTxInCount();
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
             in_stack_fffffffffffffbf0,
             (int *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
             (uint *)in_stack_fffffffffffffbe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x255e34);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x332,pcVar2);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    testing::Message::~Message((Message *)0x255e91);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x255ee9);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000"
             ,pcVar2);
  std::__cxx11::string::~string(local_358);
  cfd::core::ByteData::~ByteData((ByteData *)0x255f65);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
  if (!bVar1) {
    testing::Message::Message(local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x256017);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x334,pcVar2);
    testing::internal::AssertHelper::operator=(&local_380,local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message((Message *)0x256074);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2560c9);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_390,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,pcVar2);
  std::__cxx11::string::~string(local_3b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    in_stack_fffffffffffffbe0 =
         (Psbt *)testing::AssertionResult::failure_message((AssertionResult *)0x2561a1);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x335,(char *)in_stack_fffffffffffffbe0);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    testing::Message::~Message((Message *)0x2561ef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25623e);
  cfd::core::TxInReference::~TxInReference((TxInReference *)0x25624b);
  cfd::core::TxIn::~TxIn((TxIn *)0x256258);
  cfd::core::TxIn::~TxIn((TxIn *)0x256265);
  cfd::Psbt::~Psbt(in_stack_fffffffffffffbe0);
  return;
}

Assistant:

TEST(Psbt, SetTxInOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxInCount());
  TxIn txin_w(Txid("c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26"), 1, 0xffffffff);
  TxIn txin_l(Txid("c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d"), 0, 0xffffffff);
  TxInReference txin_r(txin_l);
  psbt.AddTxIn(txin_w);
  psbt.AddTxIn(txin_r);
  EXPECT_EQ(2, psbt.GetTxInCount());

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==", psbt.GetBase64().c_str());
}